

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_1x2(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  byte bVar2;
  uint in_EDX;
  long *in_RSI;
  int *in_RDI;
  INT32 tmp1;
  INT32 tmp0;
  
  memset(in_RDI,0,0x100);
  bVar1 = *(byte *)(*in_RSI + (ulong)in_EDX);
  bVar2 = *(byte *)(in_RSI[1] + (ulong)in_EDX);
  *in_RDI = ((uint)bVar1 + (uint)bVar2 + -0x100) * 0x20;
  in_RDI[8] = ((uint)bVar1 - (uint)bVar2) * 0x20;
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_1x2 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1;

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  tmp0 = GETJSAMPLE(sample_data[0][start_col]);
  tmp1 = GETJSAMPLE(sample_data[1][start_col]);

  /* We leave the results scaled up by an overall factor of 8.
   * We must also scale the output by (8/1)*(8/2) = 2**5.
   */

  /* Even part */
  /* Apply unsigned->signed conversion */
  data[DCTSIZE*0] = (DCTELEM) ((tmp0 + tmp1 - 2 * CENTERJSAMPLE) << 5);

  /* Odd part */
  data[DCTSIZE*1] = (DCTELEM) ((tmp0 - tmp1) << 5);
}